

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lts.c
# Opt level: O1

int lts_apply(char *in_word,char *feats,cst_lts_rules *r,lex_entry_t *out_phones)

{
  char cVar1;
  uint uVar2;
  cst_lts_model *pcVar3;
  uint uVar4;
  int iVar5;
  char *__s;
  __int32_t **pp_Var6;
  size_t sVar7;
  char **ppcVar8;
  acmod_id_t *paVar9;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  byte bVar13;
  uint uVar14;
  uint32 uVar15;
  char cVar16;
  ulong uVar17;
  byte *pbVar18;
  byte bVar19;
  long lVar20;
  long lVar21;
  char zeros [8];
  undefined8 in_stack_ffffffffffffff78;
  undefined4 uVar22;
  undefined8 local_38;
  
  __s = __ckd_salloc__(in_word,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                       ,0x6e);
  uVar22 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if ((r->letter_table == (char **)0x0) && (*__s != '\0')) {
    uVar17 = 0;
    pp_Var6 = __ctype_tolower_loc();
    do {
      __s[uVar17] = (char)(*pp_Var6)[__s[uVar17]];
      uVar17 = uVar17 + 1;
      sVar7 = strlen(__s);
      uVar22 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    } while (uVar17 < sVar7);
  }
  sVar7 = strlen(__s);
  uVar4 = (int)sVar7 + 10;
  ppcVar8 = (char **)__ckd_malloc__((long)(int)uVar4 * 8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                    ,0x75);
  out_phones->phone = ppcVar8;
  paVar9 = (acmod_id_t *)
           __ckd_malloc__((long)(int)uVar4 << 2,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                          ,0x76);
  out_phones->ci_acmod_id = paVar9;
  out_phones->phone_cnt = 0;
  __s_00 = (char *)__ckd_calloc__((long)r->context_extra_feats + (long)r->context_window_size * 2,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                  ,0x7b);
  iVar5 = r->context_window_size;
  sVar7 = strlen(__s);
  __s_01 = (char *)__ckd_calloc__(sVar7 + (long)iVar5 * 2 + 1,1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                  ,0x7e);
  if (r->letter_table == (char **)0x0) {
    uVar14 = r->context_window_size - 1;
    sprintf(__s_01,"%.*s#%s#%.*s",(ulong)uVar14,"00000000",__s,(ulong)uVar14,"00000000");
    cVar16 = '#';
  }
  else {
    local_38 = 0x202020202020202;
    uVar14 = r->context_window_size - 1;
    cVar16 = '\x01';
    sprintf(__s_01,"%.*s%c%s%c%.*s",(ulong)uVar14,&local_38,1,__s,CONCAT44(uVar22,1),uVar14,
            &local_38);
  }
  lVar21 = (long)r->context_window_size;
  cVar1 = __s_01[lVar21];
  do {
    if (cVar16 == cVar1) {
      ckd_free(__s_01);
      ckd_free(__s_00);
      ckd_free(__s);
      return 0;
    }
    pbVar18 = (byte *)(__s_01 + lVar21);
    uVar14 = r->context_window_size;
    sprintf(__s_00,"%.*s%.*s%s",(long)(int)uVar14,(long)pbVar18 - (long)(int)uVar14,(ulong)uVar14,
            pbVar18 + 1,feats);
    if (r->letter_table == (char **)0x0) {
      if (0xe5 < (byte)(*pbVar18 + 0x85)) {
        iVar5 = (int)(*pbVar18 - 0x61) % 0x1a;
        goto LAB_001122f0;
      }
    }
    else {
      iVar5 = *pbVar18 - 3;
LAB_001122f0:
      pcVar3 = r->models;
      uVar17 = (ulong)r->letter_index[iVar5];
      bVar19 = pcVar3[uVar17 * 6];
      bVar13 = pcVar3[uVar17 * 6 + 1];
      if (bVar19 != 0xff) {
        pbVar18 = pcVar3 + uVar17 * 6;
        do {
          pbVar18 = pcVar3 + (ulong)*(ushort *)(pbVar18 + (ulong)(__s_00[bVar19] != bVar13) * 2 + 2)
                             * 6;
          bVar19 = *pbVar18;
          bVar13 = pbVar18[1];
        } while (bVar19 != 0xff);
      }
      iVar5 = strcmp("epsilon",r->phone_table[bVar13]);
      if (iVar5 != 0) {
        if (uVar4 < out_phones->phone_cnt + 2) {
          lVar20 = (long)(int)uVar4;
          uVar4 = uVar4 + 10;
          ppcVar8 = (char **)__ckd_realloc__(out_phones->phone,lVar20 * 8 + 0x50,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                             ,0xa9);
          out_phones->phone = ppcVar8;
          paVar9 = (acmod_id_t *)
                   __ckd_realloc__(out_phones->ci_acmod_id,lVar20 * 4 + 0x28,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                   ,0xac);
          out_phones->ci_acmod_id = paVar9;
        }
        pcVar12 = r->phone_table[bVar13];
        __s_02 = strchr(pcVar12,0x2d);
        if (__s_02 == (char *)0x0) {
          pcVar12 = __ckd_salloc__(pcVar12,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/lts.c"
                                   ,0xb9);
          uVar14 = out_phones->phone_cnt;
          uVar15 = uVar14 + 1;
        }
        else {
          sVar7 = strlen(pcVar12);
          sVar10 = strlen(__s_02);
          pcVar11 = cst_substr(pcVar12,0,(int)sVar7 - (int)sVar10);
          pcVar12 = r->phone_table[bVar13];
          sVar7 = strlen(pcVar12);
          sVar10 = strlen(__s_02);
          pcVar12 = cst_substr(pcVar12,((int)sVar7 - (int)sVar10) + 1,(int)sVar10 + -1);
          uVar2 = out_phones->phone_cnt;
          uVar14 = uVar2 + 1;
          out_phones->phone_cnt = uVar14;
          out_phones->phone[uVar2] = pcVar11;
          uVar15 = uVar2 + 2;
        }
        out_phones->phone_cnt = uVar15;
        out_phones->phone[uVar14] = pcVar12;
      }
    }
    cVar1 = __s_01[lVar21 + 1];
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

int
lts_apply(const char *in_word, const char *feats,
          const cst_lts_rules * r, lex_entry_t * out_phones)
{
    int pos, index, i, maxphones;
    cst_lts_letter *fval_buff;
    cst_lts_letter *full_buff;
    cst_lts_phone phone;
    char *left, *right, *p;
    char hash;
    char zeros[8];
    char *word;

    /* Downcase the incoming word unless we are a non-roman alphabet. */
    word = ckd_salloc((char *) in_word);
    if (!r->letter_table)
        for (i = 0; i < strlen(word); ++i)
            word[i] = tolower(word[i]);

    /* Fill in out_phones structure as best we can. */
    maxphones = strlen(word) + 10;
    out_phones->phone = ckd_malloc(maxphones * sizeof(char *));
    out_phones->ci_acmod_id = ckd_malloc(maxphones * sizeof(acmod_id_t));
    out_phones->phone_cnt = 0;

    /* For feature vals for each letter */
    fval_buff = ckd_calloc((r->context_window_size * 2) +
                           r->context_extra_feats, sizeof(cst_lts_letter));
    /* Buffer with added contexts */
    full_buff = ckd_calloc((r->context_window_size * 2) +       /* TBD assumes single POS feat */
                           strlen(word) + 1, sizeof(cst_lts_letter));
    if (r->letter_table) {
        for (i = 0; i < 8; i++)
            zeros[i] = 2;
        sprintf((char *)full_buff, "%.*s%c%s%c%.*s",
                r->context_window_size - 1, zeros,
                1, word, 1, r->context_window_size - 1, zeros);
        hash = 1;
    }
    else {
        /* Assumes l_letter is a char and context < 8 */
        sprintf((char *)full_buff, "%.*s#%s#%.*s",
                r->context_window_size - 1, "00000000",
                word, r->context_window_size - 1, "00000000");
        hash = '#';
    }

    /* Do the prediction forwards (begone, foul LISP!) */
    for (pos = r->context_window_size; full_buff[pos] != hash; ++pos) {
        /* Fill the features buffer for the predictor */
        sprintf((char *)fval_buff, "%.*s%.*s%s",
                r->context_window_size,
                full_buff + pos - r->context_window_size,
                r->context_window_size, full_buff + pos + 1, feats);
        if ((!r->letter_table
             && ((full_buff[pos] < 'a') || (full_buff[pos] > 'z')))) {
#ifdef EXCESSIVELY_CHATTY
            E_WARN("lts:skipping unknown char \"%c\"\n", full_buff[pos]);
#endif
            continue;
        }
        if (r->letter_table)
            index = full_buff[pos] - 3;
        else
            index = (full_buff[pos] - 'a') % 26;
        phone = apply_model(fval_buff, r->letter_index[index], r->models);
        /* delete epsilons and split dual-phones */
        if (0 == strcmp("epsilon", r->phone_table[phone]))
            continue;
        /* dynamically grow out_phones if necessary. */
        if (out_phones->phone_cnt + 2 > maxphones) {
            maxphones += 10;
            out_phones->phone = ckd_realloc(out_phones->phone,
                                            maxphones * sizeof(char *));
            out_phones->ci_acmod_id = ckd_realloc(out_phones->ci_acmod_id,
                                                  maxphones *
                                                  sizeof(acmod_id_t));
        }
        if ((p = strchr(r->phone_table[phone], '-')) != NULL) {
            left = cst_substr(r->phone_table[phone], 0,
                              strlen(r->phone_table[phone]) - strlen(p));
            right = cst_substr(r->phone_table[phone],
                               (strlen(r->phone_table[phone]) -
                                strlen(p)) + 1, (strlen(p) - 1));
            out_phones->phone[out_phones->phone_cnt++] = left;
            out_phones->phone[out_phones->phone_cnt++] = right;
        }
        else
            out_phones->phone[out_phones->phone_cnt++] =
                ckd_salloc((char *) r->phone_table[phone]);
    }


    ckd_free(full_buff);
    ckd_free(fval_buff);
    ckd_free(word);
    return S3_SUCCESS;
}